

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::CalculateNumTiles
               (vector<int,_std::allocator<int>_> *numTiles,int toplevel_size,int size,
               int tile_rounding_mode)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RDI;
  int l;
  uint i;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 local_18;
  
  local_18 = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
    if (sVar2 <= local_18) break;
    iVar1 = LevelSize(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc)
    ;
    in_stack_ffffffffffffffd4 = (iVar1 + in_EDX + -1) / in_EDX;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(ulong)local_18);
    *pvVar3 = in_stack_ffffffffffffffd4;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

static void CalculateNumTiles(std::vector<int>& numTiles,
  int toplevel_size,
  int size,
  int tile_rounding_mode) {
  for (unsigned i = 0; i < numTiles.size(); i++) {
    int l = LevelSize(toplevel_size, int(i), tile_rounding_mode);
    assert(l <= std::numeric_limits<int>::max() - size + 1);

    numTiles[i] = (l + size - 1) / size;
  }
}